

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

natwm_error
array_context_get_delimiter(char *string,char delimiter,char **result,size_t *length,_Bool consume)

{
  _Bool _Var1;
  size_t local_68;
  size_t string_length;
  char *resulting_string;
  stack_item *stack_item;
  parser_token token;
  char ch;
  size_t index;
  stack *stack;
  natwm_error err;
  _Bool consume_local;
  size_t *length_local;
  char **result_local;
  char *pcStack_18;
  char delimiter_local;
  char *string_local;
  
  stack._0_4_ = 0x20;
  stack._7_1_ = consume;
  _err = length;
  length_local = (size_t *)result;
  result_local._7_1_ = delimiter;
  pcStack_18 = string;
  index = (size_t)stack_create();
  _token = 0;
LAB_00109f12:
  do {
    stack_item._7_1_ = pcStack_18[_token];
    if (stack_item._7_1_ == '\0') {
LAB_00109fc8:
      if (stack_item._7_1_ == '\0') {
        stack_destroy((stack *)index);
        string_local._4_4_ = NOT_FOUND_ERROR;
      }
      else {
        string_length = 0;
        local_68 = 0;
        stack._0_4_ = string_splice(pcStack_18,0,_token - 1,(char **)&string_length,&local_68);
        if ((natwm_error)stack == NO_ERROR) {
          *length_local = string_length;
          *_err = local_68;
          stack_destroy((stack *)index);
          string_local._4_4_ = NO_ERROR;
        }
        else {
          stack_destroy((stack *)index);
          string_local._4_4_ = (natwm_error)stack;
        }
      }
      return string_local._4_4_;
    }
    stack_item._0_4_ = char_to_token(stack_item._7_1_);
    if ((parser_token)stack_item == ARRAY_START) {
      stack_push((stack *)index,&token);
    }
    if (((parser_token)stack_item == ARRAY_END) &&
       (resulting_string = (char *)stack_pop((stack *)index),
       (stack_item *)resulting_string != (stack_item *)0x0)) {
      stack_item_destroy((stack_item *)resulting_string);
    }
    if (stack_item._7_1_ == result_local._7_1_) {
      _Var1 = stack_has_item((stack *)index);
      if (!_Var1) {
        if ((stack._7_1_ & 1) != 0) {
          _token = _token + 1;
        }
        _token = _token + 1;
        goto LAB_00109fc8;
      }
      _token = _token + 1;
      goto LAB_00109f12;
    }
    _token = _token + 1;
  } while( true );
}

Assistant:

static enum natwm_error array_context_get_delimiter(const char *string, char delimiter,
                                                    char **result, size_t *length, bool consume)
{
        enum natwm_error err = GENERIC_ERROR;
        struct stack *stack = stack_create();
        size_t index = 0;
        char ch = '\0';

        while ((ch = string[index]) != '\0') {
                enum parser_token token = char_to_token(ch);

                if (token == ARRAY_START) {
                        stack_push(stack, &index);
                }

                if (token == ARRAY_END) {
                        // We just need to delete this
                        struct stack_item *stack_item = stack_pop(stack);

                        if (stack_item != NULL) {
                                stack_item_destroy(stack_item);
                        }
                }

                if (ch != delimiter) {
                        ++index;

                        continue;
                }

                // We found the delimiter - check if the stack is empty.
                if (!stack_has_item(stack)) {
                        // If we want to include the delimiter in the final
                        // string increment the index
                        if (consume) {
                                ++index;
                        }

                        ++index;

                        break;
                }

                // We found the delimiter, but we are not in the correct
                // context, so just incremement the index and continue
                ++index;

                continue;
        }

        if (ch == '\0') {
                // We did not find anything
                stack_destroy(stack);

                return NOT_FOUND_ERROR;
        }

        char *resulting_string = NULL;
        size_t string_length = 0;

        err = string_splice(string, 0, index - 1, &resulting_string, &string_length);

        if (err != NO_ERROR) {
                stack_destroy(stack);

                return err;
        }

        *result = resulting_string;
        *length = string_length;

        stack_destroy(stack);

        return NO_ERROR;
}